

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

bool dg::vr::sameBase(ValueRelations *graph,V val1,V val2)

{
  bool bVar1;
  V local_38;
  V local_30;
  
  while (local_38 = val2, local_30 = val1, val1 != (V)0x0) {
    for (; local_38 != (V)0x0; local_38 = getGEPBase(local_38)) {
      bVar1 = ValueRelations::are<llvm::Value_const*,llvm::Value_const*>
                        (graph,&local_30,EQ,&local_38);
      if (bVar1) goto LAB_001327de;
    }
    val1 = getGEPBase(local_30);
  }
LAB_001327de:
  return val1 != (V)0x0;
}

Assistant:

bool sameBase(const ValueRelations &graph, V val1, V val2) {
    V val2orig = val2;
    while (val1) {
        val2 = val2orig;
        while (val2) {
            if (graph.are(val1, Relations::EQ,
                          val2)) // TODO compare whether indices may equal
                return true;
            val2 = getGEPBase(val2);
        }
        val1 = getGEPBase(val1);
    }
    return false;
}